

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O0

void Abc_NtkPrintBoxInfo(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  void *Entry;
  void *Entry_00;
  Vec_Int_t *p_00;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  int local_40;
  int Num;
  int k;
  int i;
  Vec_Int_t *vCounts;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pBoxModel;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vMods;
  Abc_Ntk_t *pNtk_local;
  
  if ((pNtk->pDesign != (Abc_Des_t *)0x0) && (pNtk->pDesign->vModules != (Vec_Ptr_t *)0x0)) {
    p = pNtk->pDesign->vModules;
    Vec_PtrSort(p,Abc_NtkCompareNames);
    iVar1 = Vec_PtrFind(p,pNtk);
    if ((iVar1 < 0) || (iVar2 = Vec_PtrSize(p), iVar2 <= iVar1)) {
      __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x1c3,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
    }
    Entry = Vec_PtrEntry(p,0);
    Entry_00 = Vec_PtrEntry(p,iVar1);
    Vec_PtrWriteEntry(p,0,Entry_00);
    Vec_PtrWriteEntry(p,iVar1,Entry);
    iVar1 = Vec_PtrSize(p);
    p_00 = Vec_IntStart(iVar1);
    for (Num = 0; iVar1 = Vec_PtrSize(p), Num < iVar1; Num = Num + 1) {
      pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(p,Num);
      iVar1 = Abc_NtkBoxNum(pAVar4);
      if (iVar1 != 0) {
        iVar1 = Vec_IntSize(p_00);
        Vec_IntFill(p_00,iVar1,0);
        for (local_40 = 0; iVar1 = Vec_PtrSize(pAVar4->vBoxes), local_40 < iVar1;
            local_40 = local_40 + 1) {
          pAVar5 = Abc_NtkBox(pAVar4,local_40);
          if ((pAVar5->field_5).pData != (void *)0x0) {
            iVar1 = Vec_PtrFind(p,(pAVar5->field_5).pData);
            if ((iVar1 < 0) || (iVar2 = Vec_PtrSize(p), iVar2 <= iVar1)) {
              __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                            ,0x1d5,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
            }
            Vec_IntAddToEntry(p_00,iVar1,1);
          }
        }
        printf("MODULE  ");
        pcVar6 = Abc_NtkName(pAVar4);
        printf("%-30s : ",pcVar6);
        uVar3 = Abc_NtkPiNum(pAVar4);
        printf("PI=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkPoNum(pAVar4);
        printf("PO=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkBoxNum(pAVar4);
        printf("BB=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkNodeNum(pAVar4);
        printf("ND=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkLevel(pAVar4);
        printf("Lev=%5d ",(ulong)uVar3);
        printf("\n");
        for (local_40 = 0; iVar1 = Vec_IntSize(p_00), local_40 < iVar1; local_40 = local_40 + 1) {
          uVar3 = Vec_IntEntry(p_00,local_40);
          if (uVar3 != 0) {
            pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(p,local_40);
            pcVar6 = Abc_NtkName(pAVar4);
            printf("%15d : %s\n",(ulong)uVar3,pcVar6);
          }
        }
      }
    }
    Vec_IntFree(p_00);
    for (Num = 0; iVar1 = Vec_PtrSize(p), Num < iVar1; Num = Num + 1) {
      pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(p,Num);
      iVar1 = Abc_NtkBoxNum(pAVar4);
      if (iVar1 == 0) {
        printf("MODULE   ");
        pcVar6 = Abc_NtkName(pAVar4);
        printf("%-30s : ",pcVar6);
        uVar3 = Abc_NtkPiNum(pAVar4);
        printf("PI=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkPoNum(pAVar4);
        printf("PO=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkBoxNum(pAVar4);
        printf("BB=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkNodeNum(pAVar4);
        printf("ND=%6d ",(ulong)uVar3);
        uVar3 = Abc_NtkLevel(pAVar4);
        printf("Lev=%5d ",(ulong)uVar3);
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintBoxInfo( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel, * pBoxModel;
    Abc_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pDesign == NULL || pNtk->pDesign->vModules == NULL )
    {
//        printf( "There is no hierarchy information.\n" );
        return;
    }
    // sort models by name
    vMods = pNtk->pDesign->vModules;
    Vec_PtrSort( vMods, (int(*)())Abc_NtkCompareNames );
//    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Abc_NtkName(pModel) );

    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Abc_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Abc_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Abc_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = (Abc_Ntk_t *)pObj->pData;
            if ( pBoxModel == NULL )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Abc_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) ); // sans constants
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Abc_NtkName((Abc_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE   " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) );
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );
    }
}